

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.cpp
# Opt level: O2

wstring * __thiscall
GdlFeatureDefn::GetLabelFromNameTable_abi_cxx11_
          (wstring *__return_storage_ptr__,GdlFeatureDefn *this,int nNameID,int nLangID,
          uint8 *pNameTbl)

{
  bool bVar1;
  int i;
  utf16 *dest;
  void *pvVar2;
  long lVar3;
  undefined4 in_register_0000000c;
  ulong n;
  size_t lOffset;
  size_t lSize;
  
  pvVar2 = (void *)CONCAT44(in_register_0000000c,nLangID);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::wstring::erase((ulong)__return_storage_ptr__,0);
  lOffset = 0;
  lSize = 0;
  bVar1 = TtfUtil::GetNameInfo(pvVar2,3,1,nNameID,(int)this,&lOffset,&lSize);
  if ((!bVar1) &&
     (bVar1 = TtfUtil::GetNameInfo(pvVar2,3,0,nNameID,(int)this,&lOffset,&lSize), !bVar1)) {
    return __return_storage_ptr__;
  }
  n = lSize >> 1 & 0x7fffffff;
  dest = (utf16 *)operator_new__(n * 2 + 2);
  gr::utf16ncpy(dest,(utf16 *)((long)pvVar2 + lOffset),n);
  TtfUtil::SwapWString(dest,n);
  dest[n] = 0;
  pvVar2 = operator_new__((n + 1) * 4);
  for (lVar3 = 0; n + 1 != lVar3; lVar3 = lVar3 + 1) {
    *(uint *)((long)pvVar2 + lVar3 * 4) = (uint)dest[lVar3];
  }
  std::__cxx11::wstring::assign((wchar_t *)__return_storage_ptr__,(ulong)pvVar2);
  operator_delete__(pvVar2);
  return __return_storage_ptr__;
}

Assistant:

std::wstring GdlFeatureDefn::GetLabelFromNameTable(int nNameID, int nLangID, uint8 * pNameTbl)
{
	std::wstring stuName;
	stuName.erase();
	size_t lOffset = 0;
	size_t lSize = 0;

	// The Graphite compiler stores our names in either 
	// the MS (platform id = 3) Unicode (writing system id = 1) table
	// or the MS Symbol (writing system id = 0) table. Try MS Unicode first.
	// lOffset & lSize are in bytes.
	// new interface:
	if (!TtfUtil::GetNameInfo(pNameTbl, 3, 1, nLangID, nNameID, lOffset, lSize))
	{
		if (!TtfUtil::GetNameInfo(pNameTbl, 3, 0, nLangID, nNameID, lOffset, lSize))
		{
			return stuName;	// no name found, return empty string
		}
	}

	size_t cchw = (unsigned(lSize) / sizeof(utf16));
	utf16 * pchwName = new utf16[cchw+1]; // lSize - byte count for Uni str
	const utf16 * pchwSrcName = reinterpret_cast<const utf16*>(pNameTbl + lOffset);

//	if (ppec->cbBytesPerChar == sizeof(utf16))
//	{
		utf16ncpy(pchwName, pchwSrcName, cchw);
		TtfUtil::SwapWString(pchwName, cchw); // make big endian
//	}
//	else
//	{
//		// TODO: properly handle Macintosh encoding
//		Platform_UnicodeToANSI((utf16 *)pbStr, cchwStr, (char *)pbNextString, cchwStr);
//	}

///    std::transform(pchwSrcName, pchwSrcName + cchw, pchwName, std::ptr_fun<utf16,utf16>(lsbf));
	pchwName[cchw] = 0;  // zero terminate
	#ifdef _WIN32
		stuName.assign((const wchar_t*)pchwName, cchw);
	#else
		wchar_t * pchwName32 = new wchar_t[cchw+1]; // lSize - byte count for Uni str
		for (int i = 0; i <= signed(cchw); i++) {
			pchwName32[i] = pchwName[i];
		}
		stuName.assign(pchwName32, cchw);
		delete [] pchwName32;
	#endif

	return stuName;
}